

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

NodesSeq<dg::dda::RWNode> * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createCall
          (NodesSeq<dg::dda::RWNode> *__return_storage_ptr__,LLVMReadWriteGraphBuilder *this,
          Instruction *Inst)

{
  RWNode *calledValue;
  raw_ostream *prVar1;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_58;
  initializer_list<dg::dda::RWNode_*> local_40;
  RWNode *local_30;
  
  calledValue = (RWNode *)llvm::Value::stripPointerCasts();
  if (*(char *)(*(long *)(Inst + -0x20) + 0x10) == '\x17') {
    if (createCall(llvm::Instruction_const*)::warned_inline_assembly == '\0') {
      prVar1 = (raw_ostream *)llvm::errs();
      Str.Length = 0x26;
      Str.Data = "[RWG] WARNING: Inline assembler found\n";
      llvm::raw_ostream::operator<<(prVar1,Str);
      createCall(llvm::Instruction_const*)::warned_inline_assembly = '\x01';
    }
    local_40._M_array = (iterator)createUnknownCall(this,(CallInst *)Inst);
    local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&local_40;
    local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
    NodesSeq<dg::dda::RWNode>::NodesSeq
              (__return_storage_ptr__,(initializer_list<dg::dda::RWNode_*> *)&local_58);
  }
  else {
    if ((calledValue == (RWNode *)0x0) ||
       (*(char *)&(calledValue->super_SubgraphNode<dg::dda::RWNode>).data != '\0')) {
      getCalledFunctions(&local_58,(Value *)calledValue,this->PTA);
      if (local_58.
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_58.
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        prVar1 = (raw_ostream *)llvm::errs();
        Str_00.Length = 0x4d;
        Str_00.Data = 
        "[RWG] error: could not determine the called function in a call via pointer: \n";
        prVar1 = llvm::raw_ostream::operator<<(prVar1,Str_00);
        local_40._M_array = (iterator)Inst;
        prVar1 = operator<<(prVar1,(ValInfo *)&local_40);
        Str_01.Length = 1;
        Str_01.Data = "\n";
        llvm::raw_ostream::operator<<(prVar1,Str_01);
        local_30 = createUnknownCall(this,(CallInst *)Inst);
        local_40._M_array = &local_30;
        local_40._M_len = 1;
        NodesSeq<dg::dda::RWNode>::NodesSeq(__return_storage_ptr__,&local_40);
      }
      else {
        createCallToFunctions(__return_storage_ptr__,this,&local_58,(CallInst *)Inst);
      }
    }
    else {
      local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
      local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)((iterator)
                     local_58.
                     super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
      *local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
       _M_impl.super__Vector_impl_data._M_start = (Function *)calledValue;
      local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      createCallToFunctions(__return_storage_ptr__,this,&local_58,(CallInst *)Inst);
    }
    if ((iterator)
        local_58.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (iterator)0x0) {
      operator_delete(local_58.
                      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodesSeq<RWNode>
LLVMReadWriteGraphBuilder::createCall(const llvm::Instruction *Inst) {
    using namespace llvm;
    const CallInst *CInst = cast<CallInst>(Inst);
#if LLVM_VERSION_MAJOR >= 8
    const Value *calledVal = CInst->getCalledOperand()->stripPointerCasts();
#else
    const Value *calledVal = CInst->getCalledValue()->stripPointerCasts();
#endif
    static bool warned_inline_assembly = false;

    if (CInst->isInlineAsm()) {
        if (!warned_inline_assembly) {
            llvm::errs() << "[RWG] WARNING: Inline assembler found\n";
            warned_inline_assembly = true;
        }
        return {createUnknownCall(CInst)};
    }

    if (const Function *function = dyn_cast<Function>(calledVal)) {
        return createCallToFunctions({function}, CInst);
    }

    const auto &functions = getCalledFunctions(calledVal, PTA);
    if (functions.empty()) {
        llvm::errs() << "[RWG] error: could not determine the called function "
                        "in a call via pointer: \n"
                     << ValInfo(CInst) << "\n";
        return {createUnknownCall(CInst)};
    }
    return createCallToFunctions(functions, CInst);
}